

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

bool __thiscall
amrex::BoxArray::coarsenable(BoxArray *this,IntVect *refinement_ratio,IntVect *min_width)

{
  long *plVar1;
  element_type *peVar2;
  Box *ab;
  Box *pBVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  IntVect IVar17;
  Box result;
  Box bx;
  undefined8 local_b8;
  uint uStack_b0;
  uint auStack_ac [2];
  undefined8 uStack_a4;
  Box local_98;
  IntVect *local_78;
  IntVect *local_70;
  long local_68;
  long local_60;
  int local_58 [3];
  Box local_4c;
  
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ab = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_start;
  pBVar3 = *(pointer *)
            ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data + 8);
  lVar11 = (long)pBVar3 - (long)ab;
  if (pBVar3 == ab) {
    return false;
  }
  BATransformer::operator()(&local_4c,&this->m_bat,ab);
  local_70 = refinement_ratio;
  bVar6 = Box::coarsenable(&local_4c,refinement_ratio,min_width);
  uVar12 = 0;
  if (!bVar6) {
    return false;
  }
  lVar15 = ((long)pBVar3 - (long)ab >> 2) * 0x6db6db6db6db6db7;
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = min_width;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (lVar11 < 1) {
      return true;
    }
    lVar11 = 1;
    if (1 < lVar15) {
      lVar11 = lVar15;
    }
    bVar6 = true;
    lVar15 = 0;
    do {
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = Box::coarsenable((Box *)(*(long *)&(peVar2->m_abox).
                                                                                                      
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + lVar15),
                                 local_70,local_78);
      }
      lVar15 = lVar15 + 0x1c;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    return bVar6;
  case indexType:
  case indexType_coarsenRatio:
    uVar12 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    break;
  case bndryReg:
    if (lVar11 < 1) {
      return true;
    }
    lVar11 = 1;
    if (1 < lVar15) {
      lVar11 = lVar15;
    }
    bVar6 = true;
    lVar15 = 0;
    do {
      BATbndryReg::operator()
                (&local_98,&(this->m_bat).m_op.m_bndryReg,
                 (Box *)(*(long *)&(peVar2->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + lVar15));
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = Box::coarsenable(&local_98,local_70,local_78);
      }
      lVar15 = lVar15 + 0x1c;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    return bVar6;
  default:
    uVar12 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar17 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar9 = IVar17.vect[2];
  local_58[0] = IVar17.vect[0];
  local_58[1] = IVar17.vect[1];
  local_58[2] = IVar17.vect[2];
  if (pBVar3 == ab || lVar11 < 0) {
    bVar6 = true;
  }
  else {
    iVar14 = IVar17.vect[0];
    iVar16 = IVar17.vect[1];
    lVar11 = 1;
    if (1 < lVar15) {
      lVar11 = lVar15;
    }
    bVar6 = true;
    local_60 = 0;
    local_68 = lVar11;
    do {
      lVar15 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data;
      plVar1 = (long *)(lVar15 + local_60 * 0x1c);
      lVar13 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar15 + 0xc + local_60 * 0x1c);
      lVar15 = *plVar1;
      lVar5 = plVar1[1];
      auStack_ac[1] = (uint)((ulong)lVar15 >> 0x20);
      uStack_a4 = lVar5;
      uStack_b0 = (uint)lVar4;
      auStack_ac[0] = (uint)((ulong)lVar4 >> 0x20);
      local_b8._4_4_ = (uint)((ulong)lVar13 >> 0x20);
      uVar8 = local_b8._4_4_;
      if (iVar16 == 1 && iVar14 == 1) {
        local_b8 = lVar13;
        if (iVar9 != 1) goto LAB_00455e9e;
      }
      else {
        local_b8._0_4_ = (uint)lVar13;
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if ((int)(uint)local_b8 < 0) {
              local_b8._0_4_ = (int)(uint)local_b8 >> 2;
            }
            else {
              local_b8._0_4_ = (uint)local_b8 >> 2;
            }
          }
          else if (iVar14 == 2) {
            if ((int)(uint)local_b8 < 0) {
              local_b8._0_4_ = (int)(uint)local_b8 >> 1;
            }
            else {
              local_b8._0_4_ = (uint)local_b8 >> 1;
            }
          }
          else if ((int)(uint)local_b8 < 0) {
            local_b8._0_4_ = ~((int)~(uint)local_b8 / iVar14);
          }
          else {
            local_b8._0_4_ = (int)(uint)local_b8 / iVar14;
          }
        }
        if (iVar16 != 1) {
          if (iVar16 == 4) {
            if (lVar13 < 0) {
              uVar8 = (int)local_b8._4_4_ >> 2;
            }
            else {
              uVar8 = local_b8._4_4_ >> 2;
            }
          }
          else if (iVar16 == 2) {
            if (lVar13 < 0) {
              uVar8 = (int)local_b8._4_4_ >> 1;
            }
            else {
              uVar8 = local_b8._4_4_ >> 1;
            }
          }
          else if (lVar13 < 0) {
            uVar8 = ~((int)~local_b8._4_4_ / iVar16);
          }
          else {
            uVar8 = (int)local_b8._4_4_ / iVar16;
          }
        }
LAB_00455e9e:
        local_b8 = CONCAT44(uVar8,(uint)local_b8);
        if (iVar9 != 1) {
          if (iVar9 == 4) {
            if ((int)uStack_b0 < 0) {
              uStack_b0 = (int)uStack_b0 >> 2;
            }
            else {
              uStack_b0 = uStack_b0 >> 2;
            }
          }
          else if (iVar9 == 2) {
            if ((int)uStack_b0 < 0) {
              uStack_b0 = (int)uStack_b0 >> 1;
            }
            else {
              uStack_b0 = uStack_b0 >> 1;
            }
          }
          else if ((int)uStack_b0 < 0) {
            uStack_b0 = ~((int)~uStack_b0 / iVar9);
          }
          else {
            uStack_b0 = (int)uStack_b0 / iVar9;
          }
        }
        uStack_a4._4_4_ = (uint)((ulong)lVar5 >> 0x20);
        uStack_a4._0_4_ = (uint)lVar5;
        if (uStack_a4._4_4_ == 0) {
          uVar8 = auStack_ac[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar8 = (int)auStack_ac[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = auStack_ac[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar8 = (int)auStack_ac[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = auStack_ac[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~((int)~auStack_ac[0] / iVar14);
            }
            else {
              uVar8 = (int)auStack_ac[0] / iVar14;
            }
          }
          auStack_ac[0] = uVar8;
          uVar8 = auStack_ac[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar8 = (int)auStack_ac[1] >> 2;
              if (-1 < lVar15) {
                uVar8 = auStack_ac[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar8 = (int)auStack_ac[1] >> 1;
              if (-1 < lVar15) {
                uVar8 = auStack_ac[1] >> 1;
              }
            }
            else if (lVar15 < 0) {
              uVar8 = ~((int)~auStack_ac[1] / iVar16);
            }
            else {
              uVar8 = (int)auStack_ac[1] / iVar16;
            }
          }
          auStack_ac[1] = uVar8;
          uVar8 = (uint)uStack_a4;
          if (iVar9 != 1) {
            if (iVar9 == 4) {
              uVar8 = (int)(uint)uStack_a4 >> 2;
              if (-1 < (int)(uint)uStack_a4) {
                uVar8 = (uint)uStack_a4 >> 2;
              }
            }
            else if (iVar9 == 2) {
              uVar8 = (int)(uint)uStack_a4 >> 1;
              if (-1 < (int)(uint)uStack_a4) {
                uVar8 = (uint)uStack_a4 >> 1;
              }
            }
            else if ((int)(uint)uStack_a4 < 0) {
              uVar8 = ~((int)~(uint)uStack_a4 / iVar9);
            }
            else {
              uVar8 = (int)(uint)uStack_a4 / iVar9;
            }
          }
        }
        else {
          local_98.smallend.vect[0] = 0;
          local_98.smallend.vect[1] = 0;
          local_98.smallend.vect[2] = 0;
          lVar13 = 0;
          do {
            if (((uStack_a4._4_4_ >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
               ((int)auStack_ac[lVar13] % local_58[lVar13] != 0)) {
              local_98.smallend.vect[lVar13] = 1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          uVar8 = auStack_ac[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar8 = (int)auStack_ac[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = auStack_ac[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar8 = (int)auStack_ac[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = auStack_ac[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~((int)~auStack_ac[0] / iVar14);
            }
            else {
              uVar8 = (int)auStack_ac[0] / iVar14;
            }
          }
          uVar10 = auStack_ac[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar10 = (int)auStack_ac[1] >> 2;
              if (-1 < lVar15) {
                uVar10 = auStack_ac[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar10 = (int)auStack_ac[1] >> 1;
              if (-1 < lVar15) {
                uVar10 = auStack_ac[1] >> 1;
              }
            }
            else if (lVar15 < 0) {
              uVar10 = ~((int)~auStack_ac[1] / iVar16);
            }
            else {
              uVar10 = (int)auStack_ac[1] / iVar16;
            }
          }
          uVar7 = (uint)uStack_a4;
          if (iVar9 != 1) {
            if (iVar9 == 4) {
              uVar7 = (int)(uint)uStack_a4 >> 2;
              if (-1 < (int)(uint)uStack_a4) {
                uVar7 = (uint)uStack_a4 >> 2;
              }
            }
            else if (iVar9 == 2) {
              uVar7 = (int)(uint)uStack_a4 >> 1;
              if (-1 < (int)(uint)uStack_a4) {
                uVar7 = (uint)uStack_a4 >> 1;
              }
            }
            else if ((int)(uint)uStack_a4 < 0) {
              uVar7 = ~((int)~(uint)uStack_a4 / iVar9);
            }
            else {
              uVar7 = (int)(uint)uStack_a4 / iVar9;
            }
          }
          auStack_ac[0] = uVar8 + local_98.smallend.vect[0];
          auStack_ac[1] = uVar10 + local_98.smallend.vect[1];
          uVar8 = uVar7 + local_98.smallend.vect[2];
        }
        uStack_a4 = CONCAT44(uStack_a4._4_4_,uVar8);
      }
      local_98.bigend.vect[1] = auStack_ac[1];
      local_98.bigend.vect[2] = (uint)uStack_a4;
      local_98.smallend.vect[0] = (uint)local_b8;
      local_98.smallend.vect[1] = local_b8._4_4_;
      local_98.smallend.vect[2] = uStack_b0;
      local_98.bigend.vect[0] = auStack_ac[0];
      lVar15 = 0;
      local_98.btype.itype = uStack_a4._4_4_;
      do {
        uVar10 = 1 << ((byte)lVar15 & 0x1f);
        uVar8 = (uint)lVar15;
        local_98.bigend.vect[lVar15] =
             (local_98.bigend.vect[lVar15] + (uint)((uVar12 >> (uVar8 & 0x1f) & 1) != 0)) -
             (uint)((local_98.btype.itype >> (uVar8 & 0x1f) & 1) != 0);
        if ((uVar12 >> (uVar8 & 0x1f) & 1) == 0) {
          local_98.btype.itype = ~uVar10 & local_98.btype.itype;
        }
        else {
          local_98.btype.itype = uVar10 | local_98.btype.itype;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = Box::coarsenable(&local_98,local_70,local_78);
        lVar11 = local_68;
      }
      local_60 = local_60 + 1;
    } while (local_60 != lVar11);
  }
  return bVar6;
}

Assistant:

bool
BoxArray::coarsenable (const IntVect& refinement_ratio, const IntVect& min_width) const
{
    const Long sz = size();
    if(size() == 0) return false;

    const Box& first = (*this)[0];
    bool res = first.coarsenable(refinement_ratio,min_width);
    if (res == false) return false;

    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = bxs[ibox];
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = amrex::convert(amrex::coarsen(bxs[ibox],cr),t);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = m_bat.m_op.m_bndryReg(bxs[ibox]);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    }

    return res;
}